

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

int __thiscall QThread::exec(QThread *this)

{
  qsizetype *this_00;
  QObjectData *pQVar1;
  int iVar2;
  QBindingStatus *status;
  long in_FS_OFFSET;
  QEventLoop local_48;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  status = QtPrivate::getBindingStatus();
  this_00 = &pQVar1[1].children.d.size;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30._0_8_ = this_00;
  QBasicMutex::lock((QBasicMutex *)this_00);
  local_30[8] = true;
  QtPrivate::BindingStatusOrList::setStatusAndClearList
            ((BindingStatusOrList *)&pQVar1[2].parent,status);
  *(undefined1 *)((long)&pQVar1[2].q_ptr[8].d_ptr.d + 4) = 0;
  if (*(char *)((long)&pQVar1[1].postedEvents.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1) ==
      '\x01') {
    *(undefined1 *)
     ((long)&pQVar1[1].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
             _q_value.super___atomic_base<int>._M_i + 1) = 0;
    iVar2 = *(int *)((long)&pQVar1[1].metaObject + 4);
  }
  else {
    QBasicMutex::unlock((QBasicMutex *)this_00);
    local_30[8] = false;
    local_48.super_QObject._vptr_QObject = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_48.super_QObject.d_ptr.d = (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
    QEventLoop::QEventLoop(&local_48,(QObject *)0x0);
    iVar2 = QEventLoop::exec(&local_48,(ProcessEventsFlags)0x0);
    QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
    local_30[8] = true;
    *(undefined1 *)
     ((long)&pQVar1[1].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
             _q_value.super___atomic_base<int>._M_i + 1) = 0;
    *(undefined4 *)((long)&pQVar1[1].metaObject + 4) = 0xffffffff;
    QEventLoop::~QEventLoop(&local_48);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QThread::exec()
{
    Q_D(QThread);
    const auto status = QtPrivate::getBindingStatus(QtPrivate::QBindingStatusAccessToken{});

    QMutexLocker locker(&d->mutex);
    d->m_statusOrPendingObjects.setStatusAndClearList(status);
    d->data->quitNow = false;
    if (d->exited) {
        d->exited = false;
        return d->returnCode;
    }
    locker.unlock();

    QEventLoop eventLoop;
    int returnCode = eventLoop.exec();

    locker.relock();
    d->exited = false;
    d->returnCode = -1;
    return returnCode;
}